

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QString * QSysInfo::prettyProductName(void)

{
  QByteArrayView ba;
  QByteArrayView ba_00;
  bool bVar1;
  int iVar2;
  QUnixOSVersion *in_RDI;
  long in_FS_OFFSET;
  QUnixOSVersion unixOsVersion;
  utsname u;
  QUnixOSVersion *in_stack_fffffffffffffd38;
  QUnixOSVersion *a;
  QByteArrayView *this;
  QByteArrayView local_238;
  undefined1 *local_228;
  undefined1 *puVar3;
  storage_type *psVar4;
  utsname local_18e;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  psVar4 = &DAT_aaaaaaaaaaaaaaaa;
  local_228 = &DAT_aaaaaaaaaaaaaaaa;
  puVar3 = &DAT_aaaaaaaaaaaaaaaa;
  local_238.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_238.m_data = &DAT_aaaaaaaaaaaaaaaa;
  this = &local_238;
  a = in_RDI;
  QUnixOSVersion::QUnixOSVersion(in_RDI);
  findUnixOsVersion(in_stack_fffffffffffffd38);
  bVar1 = QString::isEmpty((QString *)0x25b006);
  if (bVar1) {
    memset(&local_18e,0xaa,0x186);
    iVar2 = uname(&local_18e);
    if (iVar2 == 0) {
      QByteArrayView::QByteArrayView<65ul>(this,(char (*) [65])a);
      ba.m_data = psVar4;
      ba.m_size = (qsizetype)puVar3;
      QString::fromLatin1(ba);
      ::operator+(&a->productType,(char16_t *)in_RDI);
      QByteArrayView::QByteArrayView<65ul>(this,(char (*) [65])a);
      ba_00.m_data = psVar4;
      ba_00.m_size = (qsizetype)puVar3;
      QString::fromLatin1(ba_00);
      ::operator+((QStringBuilder<QString,_char16_t> *)a,&in_RDI->productType);
      ::QStringBuilder::operator_cast_to_QString
                ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)
                 in_stack_fffffffffffffd38);
      QStringBuilder<QStringBuilder<QString,_char16_t>,_QString>::~QStringBuilder
                ((QStringBuilder<QStringBuilder<QString,_char16_t>,_QString> *)in_RDI);
      QString::~QString((QString *)0x25b128);
      QStringBuilder<QString,_char16_t>::~QStringBuilder
                ((QStringBuilder<QString,_char16_t> *)0x25b135);
      QString::~QString((QString *)0x25b13f);
    }
    else {
      unknownText();
    }
  }
  else {
    QString::QString(&in_RDI->productType,&in_stack_fffffffffffffd38->productType);
  }
  QUnixOSVersion::~QUnixOSVersion(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &a->productType;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::prettyProductName()
{
#if defined(Q_OS_ANDROID) || defined(Q_OS_DARWIN) || defined(Q_OS_WIN)
    const auto version = QOperatingSystemVersion::current();
    const int majorVersion = version.majorVersion();
    const QString versionString = QString::asprintf("%d.%d", majorVersion, version.minorVersion());
    QString result = version.name() + u' ';
    const char *name = osVer_helper(version);
    if (!name)
        return result + versionString;
    result += QLatin1StringView(name);
#  if !defined(Q_OS_WIN)
    return result + " ("_L1 + versionString + u')';
#  else
    // (resembling winver.exe): Windows 10 "Windows 10 Version 1809"
    const auto displayVersion = windowsDisplayVersion();
    if (!displayVersion.isEmpty())
        result += " Version "_L1 + displayVersion;
    return result;
#  endif // Windows
#elif defined(Q_OS_HAIKU)
    return "Haiku "_L1 + productVersion();
#elif defined(Q_OS_UNIX)
#  ifdef USE_ETC_OS_RELEASE
    QUnixOSVersion unixOsVersion;
    findUnixOsVersion(unixOsVersion);
    if (!unixOsVersion.prettyName.isEmpty())
        return unixOsVersion.prettyName;
#  endif
    struct utsname u;
    if (uname(&u) == 0)
        return QString::fromLatin1(u.sysname) + u' ' + QString::fromLatin1(u.release);
#endif
    return unknownText();
}